

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createBranch(Builder *this,bool implicit,Block *block)

{
  Id id;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  Instruction *local_28;
  Instruction *branch;
  Block *block_local;
  Builder *pBStack_10;
  bool implicit_local;
  Builder *this_local;
  
  branch = (Instruction *)block;
  block_local._7_1_ = implicit;
  pBStack_10 = this;
  this_00 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(this_00,OpBranch);
  local_28 = this_00;
  id = Block::getId((Block *)branch);
  spv::Instruction::addIdOperand(this_00,id);
  if ((block_local._7_1_ & 1) == 0) {
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
               local_28);
    addInstruction(this,&local_38);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_38);
  }
  else {
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
               local_28);
    addInstructionNoDebugInfo(this,&local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_30);
  }
  Block::addPredecessor((Block *)branch,this->buildPoint);
  return;
}

Assistant:

void Builder::createBranch(bool implicit, Block* block)
{
    Instruction* branch = new Instruction(OpBranch);
    branch->addIdOperand(block->getId());
    if (implicit) {
        addInstructionNoDebugInfo(std::unique_ptr<Instruction>(branch));
    }
    else {
        addInstruction(std::unique_ptr<Instruction>(branch));
    }
    block->addPredecessor(buildPoint);
}